

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_base.c
# Opt level: O3

MPP_RET hal_vp8e_enc_strm_code(void *hal,HalEncTask *task)

{
  Vp8ePutBitBuf *bitbuf;
  RK_U8 *data;
  undefined8 *puVar1;
  undefined8 uVar2;
  byte *pbVar3;
  undefined1 uVar4;
  int iVar5;
  RK_S32 RVar6;
  RK_S32 RVar7;
  size_t sVar8;
  RK_U8 *pRVar9;
  void *pvVar10;
  undefined8 *puVar11;
  RK_U32 *buf;
  uint *puVar12;
  byte bVar13;
  long lVar14;
  undefined8 *puVar15;
  RK_U32 *pRVar16;
  HalVp8eCtx *ctx;
  uint uVar17;
  undefined1 *puVar18;
  uint uVar19;
  int iVar20;
  undefined8 *puVar21;
  ulong uVar22;
  undefined8 *puVar23;
  long lVar24;
  uint uVar25;
  undefined8 *puVar26;
  char *pcVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  uint uVar31;
  int iVar32;
  RK_U32 RVar33;
  int iVar34;
  long lVar35;
  char *pcVar36;
  bool bVar37;
  undefined4 uVar38;
  undefined4 uVar40;
  undefined8 uVar39;
  undefined8 uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  RK_S32 ref_update [4];
  RK_S32 mode_update [4];
  int local_90;
  uint auStack_88 [4];
  uint auStack_78 [5];
  VepuOffsetCfg local_64;
  
  lVar14 = *(long *)((long)hal + 0x70);
  *(undefined8 *)((long)hal + 0x68a0) = 0;
  *(undefined8 *)((long)hal + 0x68a8) = 0;
  *(undefined8 *)((long)hal + 0x68b0) = 0;
  *(undefined8 *)((long)hal + 0x68b8) = 0;
  *(undefined8 *)((long)hal + 0x68c0) = 0;
  *(undefined8 *)((long)hal + 0x68c8) = 0;
  *(undefined8 *)((long)hal + 0x68d0) = 0;
  *(undefined8 *)((long)hal + 0x68d8) = 0;
  *(undefined8 *)((long)hal + 0x68e0) = 0;
  *(undefined8 *)((long)hal + 0x68e8) = 0;
  *(undefined8 *)((long)hal + 0x68f0) = 0;
  *(undefined8 *)((long)hal + 0x68f8) = 0;
  *(undefined8 *)((long)hal + 0x68fc) = 0;
  *(undefined8 *)((long)hal + 0x6904) = 0;
  local_64.fmt = *(MppFrameFormat *)(lVar14 + 0x24);
  local_64._4_8_ = *(undefined8 *)(lVar14 + 0xc);
  local_64._12_8_ = *(undefined8 *)(lVar14 + 0x14);
  local_64.offset_x = mpp_frame_get_offset_x(task->frame);
  local_64.offset_y = mpp_frame_get_offset_y(task->frame);
  get_vepu_offset_cfg(&local_64);
  iVar5 = mpp_buffer_get_fd_with_caller(task->input,"hal_vp8e_enc_strm_code");
  *(int *)((long)hal + 0x1d4) = iVar5;
  *(int *)((long)hal + 0x1dc) = iVar5;
  *(int *)((long)hal + 0x1e4) = iVar5;
  *(RK_U32 *)((long)hal + 0x1d8) = local_64.offset_byte[0];
  *(RK_U32 *)((long)hal + 0x1e0) = local_64.offset_byte[1];
  *(RK_U32 *)((long)hal + 0x1e8) = local_64.offset_byte[2];
  lVar14 = *(long *)((long)hal + 0x60);
  sVar8 = mpp_buffer_get_size_with_caller(*(MppBuffer *)(lVar14 + 0x58),"hal_vp8e_enc_strm_code");
  iVar5 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar14 + 0x58),"hal_vp8e_enc_strm_code");
  pRVar9 = (RK_U8 *)mpp_buffer_get_ptr_with_caller
                              (*(MppBuffer *)(lVar14 + 0x58),"hal_vp8e_enc_strm_code");
  lVar35 = 3;
  if (*(int *)((long)hal + 0x6924) == 0) {
    lVar35 = 10;
  }
  data = pRVar9 + lVar35;
  iVar34 = (int)lVar35;
  vp8e_set_buffer((Vp8ePutBitBuf *)((long)hal + 0x37f8),pRVar9,iVar34);
  *(int *)((long)hal + 0x194) = iVar5;
  *(int *)((long)hal + 0x198) = iVar34;
  pRVar9 = (RK_U8 *)((ulong)(data + (sVar8 & 0xffffffff) / 10) & 0xfffffffffffffff8);
  bitbuf = (Vp8ePutBitBuf *)((long)hal + 0x3820);
  iVar32 = ((uint)(data + (sVar8 & 0xffffffff) / 10) & 0xfffffff8) - (int)data;
  vp8e_set_buffer(bitbuf,data,iVar32);
  iVar32 = iVar32 + iVar34;
  *(int *)((long)hal + 0x394) = iVar5;
  *(int *)((long)hal + 0x3b4) = iVar32;
  pvVar10 = mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar14 + 0x58),"hal_vp8e_enc_strm_code");
  local_90 = (int)sVar8;
  iVar34 = ((int)pvVar10 + local_90 & 0xfffffff8U) - (int)pRVar9;
  vp8e_set_buffer((Vp8ePutBitBuf *)((long)hal + 0x3848),pRVar9,iVar34);
  *(int *)((long)hal + 0x398) = iVar5;
  *(int *)((long)hal + 0x3b8) = iVar32 + iVar34;
  *(int *)((long)hal + 0x19c) = iVar34;
  puVar15 = *(undefined8 **)((long)hal + 0x37e8);
  *(undefined1 *)((long)puVar15 + 0x26) = 1;
  *(undefined4 *)(puVar15 + 4) = *(undefined4 *)((long)hal + 0x6918);
  bVar37 = *(int *)((long)hal + 0x6924) == 0;
  *(bool *)((long)puVar15 + 0x24) = bVar37;
  if (bVar37) {
    *(undefined1 *)((long)puVar15 + 0x25) = 0;
    *(undefined2 *)((long)puVar15 + 0x27) = 0x101;
    *(undefined1 *)((long)puVar15 + 0x29) = 1;
    puVar11 = (undefined8 *)((long)hal + 0x3660);
    lVar14 = 4;
    do {
      if (puVar11 != puVar15) {
        puVar11[4] = 0xffffffff;
        *(undefined4 *)((long)puVar11 + 0x27) = 0;
      }
      puVar11 = puVar11 + 7;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
  }
  puVar11 = (undefined8 *)((long)hal + 0x3740);
  *(undefined8 *)((long)hal + 0x3760) = 0xffffffff;
  *(undefined4 *)((long)hal + 0x3767) = 0;
  *(undefined8 *)((long)hal + 0x3798) = 0xffffffff;
  *(undefined4 *)((long)hal + 0x379f) = 0;
  *(undefined8 *)((long)hal + 0x37d0) = 0xffffffff;
  *(undefined4 *)((long)hal + 0x37d7) = 0;
  puVar23 = (undefined8 *)((long)hal + 0x3660);
  uVar22 = (ulong)*(uint *)((long)hal + 0x3640);
  if (-1 < (int)*(uint *)((long)hal + 0x3640)) {
    lVar14 = uVar22 + 1;
    puVar21 = puVar23;
    lVar35 = lVar14;
    do {
      puVar26 = puVar23;
      lVar29 = lVar14;
      if (puVar21 != puVar15 && *(char *)((long)puVar21 + 0x27) != '\0') {
        *(undefined8 *)((long)hal + 0x3770) = puVar21[6];
        uVar39 = *puVar21;
        uVar41 = puVar21[1];
        auVar42 = *(undefined1 (*) [16])(puVar21 + 2);
        uVar2 = puVar21[5];
        *(undefined8 *)((long)hal + 0x3760) = puVar21[4];
        *(undefined8 *)((long)hal + 0x3768) = uVar2;
        *(undefined1 (*) [16])((long)hal + 0x3750) = auVar42;
        *puVar11 = uVar39;
        *(undefined8 *)((long)hal + 0x3748) = uVar41;
        uVar17 = 1;
        goto LAB_00268856;
      }
      puVar21 = puVar21 + 7;
      lVar35 = lVar35 + -1;
    } while (lVar35 != 0);
    uVar17 = 0;
LAB_00268856:
    do {
      puVar21 = puVar23;
      if (puVar26 != puVar15 && *(char *)((long)puVar26 + 0x29) != '\0') {
        uVar30 = (ulong)uVar17;
        uVar17 = uVar17 + 1;
        lVar35 = uVar30 * 0x38;
        *(undefined8 *)((long)hal + lVar35 + 0x3770) = puVar26[6];
        uVar39 = *puVar26;
        uVar41 = puVar26[1];
        auVar42 = *(undefined1 (*) [16])(puVar26 + 2);
        uVar2 = puVar26[5];
        puVar1 = (undefined8 *)((long)hal + lVar35 + 0x3760);
        *puVar1 = puVar26[4];
        puVar1[1] = uVar2;
        *(undefined1 (*) [16])((long)hal + lVar35 + 0x3750) = auVar42;
        puVar11[uVar30 * 7] = uVar39;
        (puVar11 + uVar30 * 7)[1] = uVar41;
        break;
      }
      lVar29 = lVar29 + -1;
      puVar26 = puVar26 + 7;
    } while (lVar29 != 0);
    do {
      if (puVar21 != puVar15 && *(char *)(puVar21 + 5) != '\0') {
        lVar14 = (ulong)uVar17 * 0x38;
        *(undefined8 *)((long)hal + lVar14 + 0x3770) = puVar21[6];
        uVar39 = *puVar21;
        uVar41 = puVar21[1];
        auVar42 = *(undefined1 (*) [16])(puVar21 + 2);
        uVar2 = puVar21[5];
        puVar15 = (undefined8 *)((long)hal + lVar14 + 0x3760);
        *puVar15 = puVar21[4];
        puVar15[1] = uVar2;
        *(undefined1 (*) [16])((long)hal + lVar14 + 0x3750) = auVar42;
        puVar11[(ulong)uVar17 * 7] = uVar39;
        (puVar11 + (ulong)uVar17 * 7)[1] = uVar41;
        break;
      }
      lVar14 = lVar14 + -1;
      puVar21 = puVar21 + 7;
    } while (lVar14 != 0);
    if (uVar22 != 0) {
      lVar14 = 0;
      do {
        *(undefined2 *)((long)hal + lVar14 + 0x3767) = 0;
        *(undefined1 *)((long)hal + lVar14 + 0x3769) = 0;
        lVar14 = lVar14 + 0x38;
      } while (uVar22 * 0x38 - lVar14 != 0);
    }
  }
  if (*(int *)((long)hal + 0x6924) == 1) {
    lVar14 = *(long *)((long)hal + 0x37e8);
    *(undefined1 *)(lVar14 + 0x25) = 1;
    *(undefined1 *)(lVar14 + 0x29) = 1;
    *(undefined2 *)(lVar14 + 0x27) = 0x101;
    *(undefined1 *)((long)hal + 0x376a) = 1;
    *(undefined1 *)((long)hal + 0x37a2) = 1;
    *(undefined1 *)((long)hal + 0x37da) = 1;
  }
  lVar14 = *(long *)((long)hal + 0x158);
  if (*(char *)(lVar14 + 2) == '\0') {
    return MPP_OK;
  }
  if ((*(int *)(lVar14 + 0x5c) != 0) &&
     (lVar35 = *(long *)((long)hal + 0x37e8), *(undefined1 *)(lVar35 + 0x29) = 1,
     *(char *)(lVar35 + 0x28) == '\0')) {
    *(undefined1 *)((long)hal + 0x37a0) = 1;
  }
  lVar35 = *(long *)((long)hal + 0x128);
  lVar29 = -0x10;
  do {
    *(undefined4 *)(lVar35 + 0x2c + lVar29) = *(undefined4 *)(lVar14 + 0x18);
    *(undefined4 *)(lVar35 + 0x3c + lVar29) = *(undefined4 *)((long)hal + 0xa8);
    lVar29 = lVar29 + 4;
  } while (lVar29 != 0);
  uVar17 = *(uint *)((long)hal + 0x3640);
  if ((long)(int)uVar17 < 2) {
    puVar15 = *(undefined8 **)((long)hal + 0x37e8);
    *(undefined2 *)(puVar15 + 5) = 0;
    bVar13 = 1;
    if (uVar17 == 1) goto LAB_002689e9;
  }
  else {
    puVar15 = *(undefined8 **)((long)hal + 0x37e8);
    if (uVar17 == 2) {
      *(undefined1 *)(puVar15 + 5) = 0;
      bVar13 = 1;
    }
    else {
      bVar13 = 0;
    }
LAB_002689e9:
    puVar18 = (undefined1 *)((long)hal + 0x3769);
    uVar22 = (ulong)uVar17;
    do {
      if (((int)uVar17 < 2) || (*(char *)((long)puVar15 + 0x29) != '\0')) {
        *puVar18 = 0;
      }
      if (!(bool)(~bVar13 & *(char *)(puVar15 + 5) == '\0')) {
        puVar18[-1] = 0;
      }
      puVar18 = puVar18 + 0x38;
      uVar22 = uVar22 - 1;
    } while (uVar22 != 0);
  }
  pcVar27 = (char *)((long)hal + 0x376a);
  uVar22 = 0xffffffff;
  uVar30 = 0;
  iVar5 = -1;
  do {
    if (((long)uVar30 < (long)(int)uVar17) && (*pcVar27 != '\0')) {
      iVar32 = (int)uVar30;
      if (iVar5 != -1) {
        pcVar36 = pcVar27;
        if ((int)uVar22 != -1) goto LAB_00268a60;
        uVar22 = uVar30 & 0xffffffff;
        iVar32 = iVar5;
      }
    }
    else {
      pcVar36 = (char *)((long)puVar11 + uVar30 * 0x38 + 0x2a);
LAB_00268a60:
      *pcVar36 = '\0';
      iVar32 = iVar5;
    }
    iVar5 = iVar32;
    uVar30 = uVar30 + 1;
    pcVar27 = pcVar27 + 0x38;
  } while (uVar30 != 3);
  iVar32 = 0;
  if (iVar5 != -1) {
    iVar32 = iVar5;
  }
  *(int *)((long)hal + 0x488) = iVar32;
  *(int *)((long)hal + 0x484) = iVar32;
  if (*(char *)((long)puVar15 + 0x25) != '\0') {
    *(undefined1 *)((long)hal + (long)iVar32 * 0x38 + 0x376a) = 1;
    uVar39 = *(undefined8 *)((long)hal + (long)iVar32 * 0x38 + 0x3750);
    uVar38 = (undefined4)uVar39;
    uVar40 = (undefined4)((ulong)uVar39 >> 0x20);
    *(undefined4 *)((long)hal + 0x1c4) = uVar38;
    *(undefined4 *)((long)hal + 0x1c8) = uVar38;
    *(undefined4 *)((long)hal + 0x1cc) = uVar40;
    *(undefined4 *)((long)hal + 0x1d0) = uVar40;
    *(int *)((long)hal + 0x488) = iVar32;
    *(int *)((long)hal + 0x484) = iVar32;
    *(undefined4 *)((long)hal + 0x48c) = 0;
    iVar5 = (int)uVar22;
    if (iVar5 != -1) {
      *(undefined4 *)((long)hal + 0x1c8) = *(undefined4 *)((long)hal + (long)iVar5 * 0x38 + 0x3750);
      *(undefined4 *)((long)hal + 0x1d0) = *(undefined4 *)((long)hal + (long)iVar5 * 0x38 + 0x3754);
      *(int *)((long)hal + 0x488) = iVar5;
      *(undefined4 *)((long)hal + 0x48c) = 1;
    }
  }
  *(undefined4 *)((long)hal + 0x1b4) = 0;
  iVar5 = *(int *)(puVar15 + 2);
  if (iVar5 == 0) {
    if (-1 < (int)uVar17) {
      uVar28 = 0xffffffff;
      uVar31 = 0xffffffff;
      lVar14 = 0;
      do {
        if ((((puVar23 != puVar15) &&
             ((*(byte *)((long)puVar23 + 0x27) & ~*(byte *)((long)puVar15 + 0x27)) == 0)) &&
            ((*(byte *)((long)puVar23 + 0x29) & ~*(byte *)((long)puVar15 + 0x29)) == 0)) &&
           (uVar31 = uVar28, (*(byte *)(puVar23 + 5) & ~*(byte *)(puVar15 + 5)) == 0)) {
          uVar31 = (uint)lVar14;
          uVar28 = (uint)lVar14;
        }
        lVar14 = lVar14 + 1;
        puVar23 = puVar23 + 7;
      } while ((ulong)uVar17 + 1 != lVar14);
      if (-1 < (int)uVar31) {
        *(undefined4 *)(puVar15 + 2) = *(undefined4 *)((long)hal + (ulong)uVar31 * 0x38 + 0x3670);
        *(undefined4 *)((long)hal + (ulong)uVar31 * 0x38 + 0x3670) = 0;
        iVar5 = *(int *)(puVar15 + 2);
        goto LAB_00268b84;
      }
    }
    *(undefined4 *)((long)hal + 0x1b4) = 1;
    iVar5 = 0;
  }
LAB_00268b84:
  *(int *)((long)hal + 0x1bc) = iVar5;
  *(undefined4 *)((long)hal + 0x1c0) = *(undefined4 *)((long)puVar15 + 0x14);
  vp8e_init_entropy(hal);
  lVar14 = *(long *)((long)hal + 0x60);
  pcVar27 = *(char **)((long)hal + 0x128);
  iVar5 = *(int *)(*(long *)((long)hal + 0x158) + 0x18);
  if (*(int *)((long)hal + 0x36c) != 0) {
    iVar34 = iVar5 - *(int *)((long)hal + 0x36c);
    iVar32 = 0x7f;
    if (iVar34 < 0x7f) {
      iVar32 = iVar34;
    }
    iVar34 = 0;
    if (0 < iVar32) {
      iVar34 = iVar32;
    }
    *(int *)(pcVar27 + 0x20) = iVar34;
  }
  if (*(int *)((long)hal + 0x370) != 0) {
    iVar5 = iVar5 - *(int *)((long)hal + 0x370);
    iVar32 = 0x7f;
    if (iVar5 < 0x7f) {
      iVar32 = iVar5;
    }
    iVar5 = 0;
    if (0 < iVar32) {
      iVar5 = iVar32;
    }
    *(int *)(pcVar27 + 0x24) = iVar5;
  }
  buf = (RK_U32 *)mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar14 + 0x40),"set_segmentation");
  uVar17 = *(int *)((long)hal + 0x6928) + 0xfU >> 1 & 0xfffffff8;
  RVar33 = 0;
  mpp_buffer_sync_begin_f(*(MppBuffer *)(lVar14 + 0x40),0,"set_segmentation");
  if ((*(int *)((long)hal + 0x36c) == 0) && (*(int *)((long)hal + 0x370) == 0)) {
    if ((pcVar27[0x18] != '\0') && (*pcVar27 != '\0')) {
      *(undefined1 (*) [16])(pcVar27 + 4) = (undefined1  [16])0x0;
      if (uVar17 != 0) {
        uVar31 = 0;
        uVar22 = 0;
        do {
          uVar28 = buf[uVar22];
          iVar5 = 0x1c;
          uVar19 = uVar31;
          do {
            if (uVar19 < *(uint *)((long)hal + 0x6928)) {
              *(int *)(pcVar27 + (ulong)(uVar28 >> ((byte)iVar5 & 0x1f) & 0xf) * 4 + 4) =
                   *(int *)(pcVar27 + (ulong)(uVar28 >> ((byte)iVar5 & 0x1f) & 0xf) * 4 + 4) + 1;
            }
            iVar5 = iVar5 + -4;
            uVar19 = uVar19 + 1;
          } while (iVar5 != -4);
          uVar22 = uVar22 + 1;
          uVar31 = uVar31 + 8;
        } while (uVar22 != (uVar17 >> 2) + (uint)(uVar17 >> 2 == 0));
      }
      goto LAB_00268d40;
    }
  }
  else {
    pcVar27[0x18] = '\x01';
    *(undefined1 (*) [16])(pcVar27 + 4) = (undefined1  [16])0x0;
    uVar31 = *(uint *)((long)hal + 0x6930);
    pRVar16 = buf;
    if (uVar31 != 0) {
      uVar28 = *(uint *)((long)hal + 0x692c);
      uVar19 = 0;
      RVar33 = 0;
      iVar5 = 0;
      do {
        if (uVar28 == 0) {
          uVar28 = 0;
        }
        else {
          uVar25 = 0;
          do {
            uVar22 = 0;
            if (*(uint *)((long)hal + 0x350) <= uVar25) {
              uVar22 = 0;
              if ((uVar25 <= *(uint *)((long)hal + 0x358)) &&
                 (*(uint *)((long)hal + 0x34c) <= uVar19)) {
                uVar22 = (ulong)(uVar19 <= *(uint *)((long)hal + 0x354));
              }
              if (((uVar25 <= *(uint *)((long)hal + 0x368)) &&
                  (*(uint *)((long)hal + 0x35c) <= uVar19)) &&
                 (uVar19 <= *(uint *)((long)hal + 0x364))) {
                uVar22 = 2;
              }
            }
            *(int *)(pcVar27 + uVar22 * 4 + 4) = *(int *)(pcVar27 + uVar22 * 4 + 4) + 1;
            uVar31 = iVar5 + uVar25 & 7;
            RVar33 = RVar33 | (int)uVar22 << ((char)uVar31 * '\x04' ^ 0x1cU);
            if (uVar31 == 7) {
              *pRVar16 = RVar33;
              pRVar16 = pRVar16 + 1;
              RVar33 = 0;
            }
            uVar25 = uVar25 + 1;
            uVar28 = *(uint *)((long)hal + 0x692c);
          } while (uVar25 < uVar28);
          uVar31 = *(uint *)((long)hal + 0x6930);
          iVar5 = iVar5 + uVar25;
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 < uVar31);
    }
    *pRVar16 = RVar33;
LAB_00268d40:
    vp8e_swap_endian(buf,uVar17);
  }
  mpp_buffer_sync_end_f(*(MppBuffer *)(lVar14 + 0x40),0,"set_segmentation");
  lVar14 = *(long *)((long)hal + 0x37e8);
  if ((*(char *)(lVar14 + 0x24) == '\0') && (pcVar27[0x18] != '\0')) {
    *(undefined8 *)((long)hal + 0x130) = *(undefined8 *)((long)hal + 0x128);
  }
  else {
    *(undefined4 *)((long)hal + 0x148) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x14c) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x150) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x154) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x138) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x13c) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x140) = 0xffffffff;
    *(undefined4 *)((long)hal + 0x144) = 0xffffffff;
    *(undefined8 *)((long)hal + 0x130) = 0;
  }
  if (*(int *)((long)hal + 0xc4) != 0) {
    lVar35 = *(long *)((long)hal + 0x128);
    if (*(int *)((long)hal + 0x6924) == 0) {
      *(undefined4 *)((long)hal + 0xa8) = 0x1a;
      iVar32 = (int)*(undefined8 *)(lVar35 + 0x1c);
      iVar5 = (int)((ulong)*(undefined8 *)(lVar35 + 0x1c) >> 0x20);
      *(ulong *)(lVar35 + 0x2c) =
           CONCAT44(-(uint)(-0x12 < iVar5),-(uint)(-0x12 < iVar32)) &
           (CONCAT44(-(uint)(0x6f < iVar5) >> 0x1a,-(uint)(0x6f < iVar32) >> 0x1a) |
           ~CONCAT44(-(uint)(0x6f < iVar5),-(uint)(0x6f < iVar32)) &
           CONCAT44(iVar5 / 2 + 8,iVar32 / 2 + 8));
      iVar5 = *(int *)(lVar35 + 0x24);
      iVar32 = *(int *)(lVar35 + 0x28);
      iVar34 = iVar5 / 2 + 8;
      if (0x6f < iVar5) {
        iVar34 = 0x3f;
      }
      if (iVar5 < -0x11) {
        iVar34 = 0;
      }
      RVar6 = iVar32 / 2 + 8;
      if (0x6f < iVar32) {
        RVar6 = 0x3f;
      }
      *(int *)(lVar35 + 0x34) = iVar34;
      if (iVar32 < -0x11) {
        RVar6 = 0;
      }
    }
    else {
      *(RK_S32 *)((long)hal + 0xa8) = 0xc;
      *(RK_S32 *)(lVar35 + 0x2c) = inter_level_tbl[*(int *)(lVar35 + 0x1c)];
      *(RK_S32 *)(lVar35 + 0x30) = inter_level_tbl[*(int *)(lVar35 + 0x20)];
      *(RK_S32 *)(lVar35 + 0x34) = inter_level_tbl[*(int *)(lVar35 + 0x24)];
      RVar6 = inter_level_tbl[*(int *)(lVar35 + 0x28)];
    }
    *(RK_S32 *)(lVar35 + 0x38) = RVar6;
  }
  if (*(int *)((long)hal + 200) != 0) {
    *(undefined4 *)((long)hal + 0xac) = 0;
  }
  if (*(char *)((long)hal + 0xcc) != '\0') {
    if (*(char *)((long)hal + 0xcc) == '\x02') {
      *(undefined1 *)((long)hal + 0xcc) = 1;
    }
    else if (*(int *)((long)hal + 0xa8) == 0) {
      *(undefined1 (*) [16])((long)hal + 0xd0) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)hal + 0xf0) = (undefined1  [16])0x0;
    }
    else {
      if (((*(char *)(lVar14 + 0x27) == '\0') && (*(char *)(lVar14 + 0x29) == '\0')) &&
         (*(char *)(lVar14 + 0x28) == '\0')) {
        uVar39 = *(undefined8 *)((long)hal + 0xe0);
        uVar41 = *(undefined8 *)((long)hal + 0xe8);
        *(undefined1 (*) [16])((long)hal + 0xf0) = *(undefined1 (*) [16])((long)hal + 0x100);
      }
      else {
        *(undefined8 *)((long)hal + 0xf0) = 2;
        *(undefined8 *)((long)hal + 0xf8) = 0xfffffffefffffffe;
        uVar39 = 0xfffffffe00000004;
        uVar41 = 0x400000002;
      }
      *(undefined8 *)((long)hal + 0xd0) = uVar39;
      *(undefined8 *)((long)hal + 0xd8) = uVar41;
    }
  }
  lVar35 = *(long *)((long)hal + 0x128);
  if (*(char *)(lVar14 + 0x24) != '\0') {
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x90),1);
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x94),1);
  }
  vp8e_put_lit(bitbuf,(uint)*(byte *)(lVar35 + 0x18),1);
  if (*(char *)(lVar35 + 0x18) != '\0') {
    pbVar3 = *(byte **)((long)hal + 0x128);
    uVar39 = *(undefined8 *)((long)hal + 0x140);
    uVar41 = *(undefined8 *)((long)hal + 0x138);
    uVar2 = *(undefined8 *)(pbVar3 + 0x24);
    auVar43[0] = -((char)*(undefined8 *)(pbVar3 + 0x1c) == (char)uVar41);
    auVar43[1] = -((char)((ulong)*(undefined8 *)(pbVar3 + 0x1c) >> 8) == (char)((ulong)uVar41 >> 8))
    ;
    auVar43[2] = -(pbVar3[0x1e] == (byte)((ulong)uVar41 >> 0x10));
    auVar43[3] = -(pbVar3[0x1f] == (byte)((ulong)uVar41 >> 0x18));
    auVar43[4] = -(pbVar3[0x20] == (byte)((ulong)uVar41 >> 0x20));
    auVar43[5] = -(pbVar3[0x21] == (byte)((ulong)uVar41 >> 0x28));
    auVar43[6] = -(pbVar3[0x22] == (byte)((ulong)uVar41 >> 0x30));
    auVar43[7] = -(pbVar3[0x23] == (byte)((ulong)uVar41 >> 0x38));
    auVar43[8] = -(pbVar3[0x24] == (byte)uVar39);
    auVar43[9] = -((char)((ulong)uVar2 >> 8) == (char)((ulong)uVar39 >> 8));
    auVar43[10] = -((char)((ulong)uVar2 >> 0x10) == (char)((ulong)uVar39 >> 0x10));
    auVar43[0xb] = -((char)((ulong)uVar2 >> 0x18) == (char)((ulong)uVar39 >> 0x18));
    auVar43[0xc] = -((char)((ulong)uVar2 >> 0x20) == (char)((ulong)uVar39 >> 0x20));
    auVar43[0xd] = -((char)((ulong)uVar2 >> 0x28) == (char)((ulong)uVar39 >> 0x28));
    auVar43[0xe] = -((char)((ulong)uVar2 >> 0x30) == (char)((ulong)uVar39 >> 0x30));
    auVar43[0xf] = -((char)((ulong)uVar2 >> 0x38) == (char)((ulong)uVar39 >> 0x38));
    auVar42[0] = -(pbVar3[0x2c] == *(byte *)((long)hal + 0x148));
    auVar42[1] = -(pbVar3[0x2d] == *(byte *)((long)hal + 0x149));
    auVar42[2] = -(pbVar3[0x2e] == *(byte *)((long)hal + 0x14a));
    auVar42[3] = -(pbVar3[0x2f] == *(byte *)((long)hal + 0x14b));
    auVar42[4] = -(pbVar3[0x30] == *(byte *)((long)hal + 0x14c));
    auVar42[5] = -(pbVar3[0x31] == *(byte *)((long)hal + 0x14d));
    auVar42[6] = -(pbVar3[0x32] == *(byte *)((long)hal + 0x14e));
    auVar42[7] = -(pbVar3[0x33] == *(byte *)((long)hal + 0x14f));
    auVar42[8] = -(pbVar3[0x34] == *(byte *)((long)hal + 0x150));
    auVar42[9] = -(pbVar3[0x35] == *(byte *)((long)hal + 0x151));
    auVar42[10] = -(pbVar3[0x36] == *(byte *)((long)hal + 0x152));
    auVar42[0xb] = -(pbVar3[0x37] == *(byte *)((long)hal + 0x153));
    auVar42[0xc] = -(pbVar3[0x38] == *(byte *)((long)hal + 0x154));
    auVar42[0xd] = -(pbVar3[0x39] == *(byte *)((long)hal + 0x155));
    auVar42[0xe] = -(pbVar3[0x3a] == *(byte *)((long)hal + 0x156));
    auVar42[0xf] = -(pbVar3[0x3b] == *(byte *)((long)hal + 0x157));
    auVar42 = auVar42 & auVar43;
    bVar37 = (ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar42[0xf] >> 7) << 0xf) != 0xffff;
    if (*(long *)((long)hal + 0x130) == 0) {
      *pbVar3 = 1;
      uVar17 = 1;
    }
    else {
      uVar17 = (uint)*pbVar3;
    }
    vp8e_put_lit(bitbuf,uVar17,1);
    vp8e_put_lit(bitbuf,(uint)bVar37,1);
    if (bVar37) {
      vp8e_put_lit(bitbuf,1,1);
      lVar35 = 0;
      do {
        uVar17 = *(uint *)(pbVar3 + 0x1c + lVar35 * 4);
        vp8e_put_lit(bitbuf,1,1);
        uVar31 = -uVar17;
        if (0 < (int)uVar17) {
          uVar31 = uVar17;
        }
        vp8e_put_lit(bitbuf,uVar31,7);
        vp8e_put_lit(bitbuf,uVar17 >> 0x1f,1);
        lVar35 = lVar35 + 1;
      } while (lVar35 != 4);
      lVar35 = 0;
      do {
        uVar17 = *(uint *)(pbVar3 + 0x2c + lVar35 * 4);
        vp8e_put_lit(bitbuf,1,1);
        uVar31 = -uVar17;
        if (0 < (int)uVar17) {
          uVar31 = uVar17;
        }
        vp8e_put_lit(bitbuf,uVar31,6);
        vp8e_put_lit(bitbuf,uVar17 >> 0x1f,1);
        lVar35 = lVar35 + 1;
      } while (lVar35 != 4);
    }
    if (*pbVar3 != 0) {
      iVar20 = *(int *)(pbVar3 + 8) + *(int *)(pbVar3 + 4);
      iVar34 = *(int *)(pbVar3 + 0x10) + *(int *)(pbVar3 + 0xc);
      iVar5 = (iVar20 * 0xff) / (iVar34 + iVar20);
      iVar32 = 0xff;
      if (0xfe < iVar5) {
        iVar5 = 0xff;
      }
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      *(int *)((long)hal + 0x3630) = iVar5;
      iVar5 = 0xff;
      if (iVar20 != 0) {
        iVar5 = (*(int *)(pbVar3 + 4) * 0xff) / iVar20;
      }
      if (0xfe < iVar5) {
        iVar5 = 0xff;
      }
      iVar20 = 1;
      if (1 < iVar5) {
        iVar20 = iVar5;
      }
      *(int *)((long)hal + 0x3634) = iVar20;
      if (iVar34 != 0) {
        iVar32 = (*(int *)(pbVar3 + 0xc) * 0xff) / iVar34;
      }
      iVar5 = 0xff;
      if (iVar32 < 0xff) {
        iVar5 = iVar32;
      }
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      *(int *)((long)hal + 0x3638) = iVar5;
      lVar35 = 0;
      do {
        if (*(int *)(pbVar3 + lVar35 * 4 + 4) == 0) {
          RVar6 = 0;
          RVar7 = 1;
        }
        else {
          vp8e_put_lit(bitbuf,1,1);
          RVar6 = *(RK_S32 *)((long)hal + lVar35 * 4 + 0x3630);
          RVar7 = 8;
        }
        vp8e_put_lit(bitbuf,RVar6,RVar7);
        lVar35 = lVar35 + 1;
      } while (lVar35 != 3);
    }
    uVar39 = *(undefined8 *)(pbVar3 + 0x24);
    *(undefined8 *)((long)hal + 0x138) = *(undefined8 *)(pbVar3 + 0x1c);
    *(undefined8 *)((long)hal + 0x140) = uVar39;
    uVar39 = *(undefined8 *)(pbVar3 + 0x34);
    *(undefined8 *)((long)hal + 0x148) = *(undefined8 *)(pbVar3 + 0x2c);
    *(undefined8 *)((long)hal + 0x150) = uVar39;
  }
  vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0xa4),1);
  vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0xa8),6);
  vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0xac),3);
  vp8e_put_lit(bitbuf,(uint)*(byte *)((long)hal + 0xcc),1);
  if (*(char *)((long)hal + 0xcc) != '\0') {
    if (*(char *)(lVar14 + 0x24) != '\0') {
      *(undefined1 (*) [16])((long)hal + 0x100) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)hal + 0xe0) = (undefined1  [16])0x0;
    }
    lVar35 = 0;
    bVar13 = 0;
    do {
      iVar5 = *(int *)((long)hal + lVar35 * 4 + 0xd0);
      iVar32 = *(int *)((long)hal + lVar35 * 4 + 0xe0);
      auStack_78[lVar35] = (uint)(iVar5 != iVar32);
      bVar37 = *(int *)((long)hal + lVar35 * 4 + 0xf0) != *(int *)((long)hal + 0x100 + lVar35 * 4);
      if (bVar37) {
        bVar13 = 1;
      }
      auStack_88[lVar35] = (uint)bVar37;
      if (iVar5 != iVar32) {
        bVar13 = 1;
      }
      lVar35 = lVar35 + 1;
    } while (lVar35 != 4);
    if (*(int *)((long)hal + 0x110) == 0) {
      bVar13 = 1;
    }
    vp8e_put_lit(bitbuf,(uint)bVar13,1);
    if (bVar13 != 0) {
      lVar35 = 0;
      do {
        uVar17 = auStack_88[lVar35];
        vp8e_put_lit(bitbuf,uVar17,1);
        if (uVar17 != 0) {
          uVar17 = *(uint *)((long)hal + 0xf0 + lVar35 * 4);
          uVar31 = -uVar17;
          if (0 < (int)uVar17) {
            uVar31 = uVar17;
          }
          vp8e_put_lit(bitbuf,uVar31,6);
          vp8e_put_lit(bitbuf,uVar17 >> 0x1f,1);
        }
        lVar35 = lVar35 + 1;
      } while (lVar35 != 4);
      lVar35 = 0;
      do {
        uVar17 = auStack_78[lVar35];
        vp8e_put_lit(bitbuf,uVar17,1);
        if (uVar17 != 0) {
          uVar17 = *(uint *)((long)hal + 0xd0 + lVar35 * 4);
          uVar31 = -uVar17;
          if (0 < (int)uVar17) {
            uVar31 = uVar17;
          }
          vp8e_put_lit(bitbuf,uVar31,6);
          vp8e_put_lit(bitbuf,uVar17 >> 0x1f,1);
        }
        lVar35 = lVar35 + 1;
      } while (lVar35 != 4);
      *(undefined8 *)((long)hal + 0x100) = *(undefined8 *)((long)hal + 0xf0);
      *(undefined8 *)((long)hal + 0x108) = *(undefined8 *)((long)hal + 0xf8);
      *(undefined8 *)((long)hal + 0xe0) = *(undefined8 *)((long)hal + 0xd0);
      *(undefined8 *)((long)hal + 0xe8) = *(undefined8 *)((long)hal + 0xd8);
    }
  }
  vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x98),2);
  vp8e_put_lit(bitbuf,*(RK_S32 *)(*(long *)((long)hal + 0x158) + 0x18),7);
  vp8e_put_lit(bitbuf,0,1);
  vp8e_put_lit(bitbuf,0,1);
  vp8e_put_lit(bitbuf,0,1);
  vp8e_put_lit(bitbuf,0,1);
  vp8e_put_lit(bitbuf,0,1);
  if (*(char *)(lVar14 + 0x24) == '\0') {
    iVar5 = 1;
    vp8e_put_lit(bitbuf,(uint)*(byte *)(lVar14 + 0x29),1);
    vp8e_put_lit(bitbuf,(uint)*(byte *)(lVar14 + 0x28),1);
    if (*(char *)(lVar14 + 0x29) == '\0') {
      if (*(char *)((long)hal + 0x3769) == '\0') {
        iVar5 = (uint)(*(char *)((long)hal + 0x37d9) != '\0') * 2;
      }
      vp8e_put_lit(bitbuf,iVar5,2);
    }
    if (*(char *)(lVar14 + 0x28) == '\0') {
      iVar5 = 1;
      if (*(char *)((long)hal + 0x3768) == '\0') {
        iVar5 = (uint)(*(char *)((long)hal + 0x37a0) != '\0') * 2;
      }
      vp8e_put_lit(bitbuf,iVar5,2);
    }
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0xbc),1);
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0xc0),1);
  }
  vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x110),1);
  if (*(char *)(lVar14 + 0x24) == '\0') {
    vp8e_put_lit(bitbuf,(uint)*(byte *)(lVar14 + 0x27),1);
  }
  vp8e_calc_coeff_prob
            (bitbuf,(RK_S32 (*) [4] [8] [3] [11])((long)hal + 0x13a0),
             (RK_S32 (*) [4] [8] [3] [11])((long)hal + 0x2420));
  vp8e_put_lit(bitbuf,1,1);
  vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x524),8);
  if (*(char *)(lVar14 + 0x24) == '\0') {
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x528),8);
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x52c),8);
    vp8e_put_lit(bitbuf,*(RK_S32 *)((long)hal + 0x530),8);
    vp8e_put_lit(bitbuf,0,1);
    vp8e_put_lit(bitbuf,0,1);
    vp8e_calc_mv_prob(bitbuf,(RK_S32 (*) [2] [19])((long)hal + 0x34b0),
                      (RK_S32 (*) [2] [19])((long)hal + 0x3548));
  }
  lVar14 = *(long *)((long)hal + 0x60);
  *(uint *)((long)hal + 0x19c) = *(uint *)((long)hal + 0x19c) >> 3 & 0xfffffff8;
  uVar17 = *(int *)((long)hal + 0x198) + *(int *)((long)hal + 0x3834);
  *(uint *)((long)hal + 0x198) = uVar17;
  uVar17 = uVar17 & 7;
  *(uint *)((long)hal + 0x1a0) = uVar17 << 3;
  if (uVar17 == 0) {
    *(undefined4 *)((long)hal + 0x1a8) = 0;
    uVar17 = 0;
    lVar35 = 0x1a4;
  }
  else {
    puVar12 = (uint *)((ulong)bitbuf->data & 0xfffffffffffffff8);
    bVar37 = true;
    if (uVar17 != 7) {
      uVar17 = 6;
      do {
        *(undefined1 *)((long)puVar12 + (ulong)uVar17) = 0;
        uVar17 = uVar17 - 1;
      } while (*(uint *)((long)hal + 0x1a0) >> 3 <= uVar17);
      bVar37 = 0x20 < *(uint *)((long)hal + 0x1a0);
    }
    uVar17 = *puVar12;
    *(uint *)((long)hal + 0x1a4) =
         uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
    uVar17 = 0;
    lVar35 = 0x1a8;
    if (bVar37) {
      uVar17 = (uint)*(byte *)((long)puVar12 + 6) << 8 |
               (uint)*(byte *)((long)puVar12 + 5) << 0x10 | puVar12[1] << 0x18;
    }
  }
  *(uint *)((long)hal + lVar35) = uVar17;
  if (*(int *)((long)hal + 0xb0) == 1) {
    if (*(uint *)((long)hal + 0x6928) < 0x1fe1) goto LAB_00269740;
LAB_00269728:
    *(undefined4 *)((long)hal + 0x300) = 1;
  }
  else {
    if (*(int *)((long)hal + 0xb0) == 0) goto LAB_00269728;
LAB_00269740:
    *(undefined4 *)((long)hal + 0x300) = 0;
  }
  *(undefined4 *)((long)hal + 0x188) = 1;
  if (*(int *)((long)hal + 0xb4) == 1) {
    if (*(uint *)((long)hal + 0x6928) < 0x631) goto LAB_0026977b;
  }
  else if (*(int *)((long)hal + 0xb4) != 0) {
LAB_0026977b:
    *(undefined4 *)((long)hal + 0x4f0) = 1;
    goto LAB_00269785;
  }
  *(undefined4 *)((long)hal + 0x4f0) = 0;
LAB_00269785:
  uVar17 = *(uint *)(*(long *)((long)hal + 0x158) + 0x18);
  if (*(int *)((long)hal + 0x318) == -1) {
    if (*(int *)((long)hal + 0x528) < 0x81) {
      iVar5 = 0x28;
      if (0x28 < (int)(uVar17 * 2)) {
        iVar5 = uVar17 * 2;
      }
      uVar31 = iVar5 - 0x28;
    }
    else {
      uVar31 = 0x80U - *(int *)((long)hal + 0x528) & 0xffff;
    }
    *(uint *)((long)hal + 0x318) = uVar31;
  }
  if (*(int *)((long)hal + 0x324) == -1) {
    *(undefined4 *)((long)hal + 0x324) = 0x20;
  }
  if (*(int *)((long)hal + 0x328) == -1) {
    *(undefined4 *)((long)hal + 0x328) = 0x3c0;
  }
  if (*(int *)((long)hal + 0x32c) == -1) {
    *(undefined4 *)((long)hal + 0x32c) = 8;
  }
  if (*(int *)((long)hal + 0x31c) == -1) {
    uVar31 = 0;
    if (99 < (int)uVar17) {
      uVar31 = uVar17 * 3 >> 2;
    }
    *(uint *)((long)hal + 0x31c) = uVar31;
  }
  if (*(int *)((long)hal + 800) == -1) {
    iVar5 = (uVar17 - 10) + (uVar17 >> 2);
    if ((int)uVar17 < 8) {
      iVar5 = 0;
    }
    *(int *)((long)hal + 800) = iVar5;
  }
  if (*(int *)((long)hal + 0x4f4) == 0) {
    iVar5 = 0x3ff;
    if (vp8_split_penalty_tbl[(int)uVar17] < 0x7fe) {
      iVar5 = vp8_split_penalty_tbl[(int)uVar17] / 2;
    }
    *(int *)((long)hal + 0x4f4) = iVar5;
  }
  if (*(int *)((long)hal + 0x4f8) == 0) {
    iVar5 = vp8_split_penalty_tbl[(int)uVar17];
    iVar32 = 0x3ff;
    if (iVar5 < 0x7ea) {
      iVar34 = iVar5 * 2 + 0x28;
      iVar32 = iVar5 * 2 + 0x2b;
      if (-1 < iVar34) {
        iVar32 = iVar34;
      }
      iVar32 = iVar32 >> 2;
    }
    *(int *)((long)hal + 0x4f8) = iVar32;
  }
  if (*(int *)((long)hal + 0x500) == 0) {
    iVar5 = vp8_split_penalty_tbl[(int)uVar17];
    iVar32 = 0x1ff;
    if (iVar5 < 0x3c0) {
      iVar34 = iVar5 * 8 + 500;
      iVar32 = iVar5 * 8 + 0x203;
      if (-1 < iVar34) {
        iVar32 = iVar34;
      }
      iVar32 = iVar32 >> 4;
    }
    *(int *)((long)hal + 0x500) = iVar32;
  }
  puVar18 = (undefined1 *)((long)hal + 0x278);
  lVar35 = 0;
  do {
    puVar18[-0x80] = (char)lVar35;
    RVar6 = vp8e_calc_cost_mv((RK_S32)lVar35,(RK_S32 *)((long)hal + 0x34b0));
    RVar7 = vp8e_calc_cost_mv((RK_S32)lVar35,(RK_S32 *)((long)hal + 0x34fc));
    iVar5 = (((RVar6 + RVar7) - (RVar7 + RVar6 + 1 >> 0x1f)) + 1 >> 1) * weight_tbl[(int)uVar17];
    uVar4 = (undefined1)((uint)iVar5 >> 8);
    if (0xfe < iVar5 >> 8) {
      uVar4 = 0xff;
    }
    *puVar18 = uVar4;
    lVar35 = lVar35 + 2;
    puVar18 = puVar18 + 1;
  } while (lVar35 != 0x100);
  lVar35 = *(long *)((long)hal + 0x128);
  lVar29 = 0;
  do {
    uVar17 = *(uint *)(lVar35 + 0x1c + lVar29 * 4);
    lVar24 = (long)(int)uVar17 * 0x20;
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x3d4) = *(undefined2 *)((long)hal + lVar24 + 0x3898);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x3dc) = *(undefined2 *)((long)hal + lVar24 + 0x389c);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x3e4) = *(undefined2 *)((long)hal + lVar24 + 0x4898);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x3ec) = *(undefined2 *)((long)hal + lVar24 + 0x489c);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x3f4) = *(undefined2 *)((long)hal + lVar24 + 0x5898);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x3fc) = *(undefined2 *)((long)hal + lVar24 + 0x589c);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x404) = *(undefined2 *)((long)hal + lVar24 + 0x38a0);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x40c) = *(undefined2 *)((long)hal + lVar24 + 0x38a4);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x414) = *(undefined2 *)((long)hal + lVar24 + 0x48a0);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x41c) = *(undefined2 *)((long)hal + lVar24 + 0x48a4);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x424) = *(undefined2 *)((long)hal + lVar24 + 0x58a0);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x42c) = *(undefined2 *)((long)hal + lVar24 + 0x58a4);
    *(undefined1 *)((long)hal + lVar29 + 0x434) = *(undefined1 *)((long)hal + lVar24 + 0x38a8);
    *(undefined1 *)((long)hal + lVar29 + 0x438) = *(undefined1 *)((long)hal + lVar24 + 0x38ac);
    *(undefined1 *)((long)hal + lVar29 + 0x43c) = *(undefined1 *)((long)hal + lVar24 + 0x48a8);
    *(undefined1 *)((long)hal + lVar29 + 0x440) = *(undefined1 *)((long)hal + lVar24 + 0x48ac);
    *(undefined1 *)((long)hal + lVar29 + 0x444) = *(undefined1 *)((long)hal + lVar24 + 0x58a8);
    *(undefined1 *)((long)hal + lVar29 + 0x448) = *(undefined1 *)((long)hal + lVar24 + 0x58ac);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x44c) = *(undefined2 *)((long)hal + lVar24 + 0x38b0);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x454) = *(undefined2 *)((long)hal + lVar24 + 0x38b4);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x45c) = *(undefined2 *)((long)hal + lVar24 + 0x48b0);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x464) = *(undefined2 *)((long)hal + lVar24 + 0x48b4);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x46c) = *(undefined2 *)((long)hal + lVar24 + 0x58b0);
    *(undefined2 *)((long)hal + lVar29 * 2 + 0x474) = *(undefined2 *)((long)hal + lVar24 + 0x58b4);
    *(undefined4 *)((long)hal + lVar29 * 4 + 0x4a0) = *(undefined4 *)(lVar35 + 0x2c + lVar29 * 4);
    lVar29 = lVar29 + 1;
  } while (lVar29 != 4);
  *(undefined4 *)((long)hal + 0x490) = *(undefined4 *)((long)hal + 0x383c);
  *(int *)((long)hal + 0x494) = 0x18 - *(int *)((long)hal + 0x3840);
  *(undefined4 *)((long)hal + 0x498) = *(undefined4 *)((long)hal + 0x3838);
  *(uint *)((long)hal + 0x170) = (uint)(*(char *)(*(long *)((long)hal + 0x37e8) + 0x24) != '\0');
  iVar5 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar14 + 0x38),"set_new_frame");
  *(int *)((long)hal + 0x1ac) = iVar5;
  *(undefined4 *)((long)hal + 0x49c) = *(undefined4 *)((long)hal + 0x98);
  *(undefined4 *)((long)hal + 0x184) = *(undefined4 *)((long)hal + 0xa4);
  *(undefined4 *)((long)hal + 0x4b0) = *(undefined4 *)((long)hal + 0xac);
  pbVar3 = *(byte **)((long)hal + 0x128);
  *(uint *)((long)hal + 0x47c) = (uint)pbVar3[0x18];
  *(uint *)((long)hal + 0x480) = (uint)*pbVar3;
  *pbVar3 = 0;
  *(undefined8 *)((long)hal + 0x504) = *(undefined8 *)((long)hal + 0xf0);
  *(undefined8 *)((long)hal + 0x50c) = *(undefined8 *)((long)hal + 0xf8);
  *(undefined8 *)((long)hal + 0x514) = *(undefined8 *)((long)hal + 0xd0);
  *(undefined8 *)((long)hal + 0x51c) = *(undefined8 *)((long)hal + 0xd8);
  lVar35 = 0;
  do {
    *(int *)((long)hal + lVar35 * 4 + 0x4c4) =
         (int)(intra4_mode_tree_penalty_tbl[lVar35] * (uVar17 * 2 + 8)) >> 8;
    lVar35 = lVar35 + 1;
  } while (lVar35 != 10);
  lVar35 = 0;
  do {
    *(int *)((long)hal + lVar35 * 4 + 0x4b4) =
         (int)(intra16_mode_tree_penalty_tbl[lVar35] * (uVar17 * 2 + 0x40)) >> 8;
    lVar35 = lVar35 + 1;
  } while (lVar35 != 4);
  if (*(int *)((long)hal + 0x310) == -1) {
    *(uint *)((long)hal + 0x310) = (uVar17 & 0x3fffff) << 3;
  }
  pvVar10 = mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar14 + 0x48),"set_new_frame");
  memset(pvVar10,0,0x1e8);
  mpp_buffer_sync_end_f(*(MppBuffer *)(lVar14 + 0x48),0,"set_new_frame");
  vp8e_write_entropy_tables(hal);
  return MPP_OK;
}

Assistant:

MPP_RET hal_vp8e_enc_strm_code(void *hal, HalEncTask *task)
{
    HalVp8eCtx  *ctx  = (HalVp8eCtx *)hal;
    Vp8eHwCfg *hw_cfg = &ctx->hw_cfg;
    VepuOffsetCfg hw_offset;

    MppEncCfgSet  *cfg = ctx->cfg;
    MppEncPrepCfg *prep = &cfg->prep;

    {
        RK_U32 i = 0;
        for (i = 0; i < 9; i++) {
            ctx->p_out_buf[i] = NULL;
            ctx->stream_size[i] = 0;
        }
    }

    {
        hw_offset.fmt = prep->format;

        hw_offset.width = prep->width;
        hw_offset.height = prep->height;
        hw_offset.hor_stride = prep->hor_stride;
        hw_offset.ver_stride = prep->ver_stride;
        hw_offset.offset_x = mpp_frame_get_offset_x(task->frame);
        hw_offset.offset_y = mpp_frame_get_offset_y(task->frame);

        get_vepu_offset_cfg(&hw_offset);
    }

    {
        HalEncTask *enc_task = task;

        hw_cfg->input_lum_base = mpp_buffer_get_fd(enc_task->input);
        hw_cfg->input_cb_base  = hw_cfg->input_lum_base;
        hw_cfg->input_cr_base  = hw_cfg->input_cb_base;
        hw_cfg->input_lum_offset = hw_offset.offset_byte[0];
        hw_cfg->input_cb_offset = hw_offset.offset_byte[1];
        hw_cfg->input_cr_offset  = hw_offset.offset_byte[2];
    }

    // split memory for vp8 partition
    {
        RK_S32 offset = 0;
        Vp8eVpuBuf *buffers = (Vp8eVpuBuf *)ctx->buffers;
        RK_U8 *p_end = NULL;
        RK_U32 buf_size = mpp_buffer_get_size(buffers->hw_out_buf);
        RK_U32 bus_addr = mpp_buffer_get_fd(buffers->hw_out_buf);
        RK_U8 *p_start = mpp_buffer_get_ptr(buffers->hw_out_buf);

        p_end = p_start + 3;
        if (ctx->frame_type == VP8E_FRM_KEY)
            p_end += 7;// frame tag len:I frame 10 byte, P frmae 3 byte.
        vp8e_set_buffer(&ctx->bitbuf[0], p_start, p_end - p_start);

        offset = p_end - p_start;
        hw_cfg->output_strm_base = bus_addr;
        hw_cfg->output_strm_offset = offset;

        p_start = p_end;
        p_end = p_start + buf_size / 10;
        p_end = (RK_U8 *)((size_t)p_end & ~0x7);
        vp8e_set_buffer(&ctx->bitbuf[1], p_start, p_end - p_start);

        offset += p_end - p_start;
        hw_cfg->partition_Base[0] = bus_addr;
        hw_cfg->partition_offset[0] = offset;

        p_start = p_end;
        p_end = mpp_buffer_get_ptr(buffers->hw_out_buf) + buf_size;
        p_end = (RK_U8 *)((size_t)p_end & ~0x7);
        vp8e_set_buffer(&ctx->bitbuf[2], p_start, p_end - p_start);

        offset += p_end - p_start;
        hw_cfg->partition_Base[1] = bus_addr;
        hw_cfg->partition_offset[1] = offset;
        hw_cfg->output_strm_size = p_end - p_start;

        p_start = p_end;
    }

    {
        HalVp8ePicBuf *pic_buf = &ctx->picbuf;

        pic_buf->cur_pic->show = 1;
        pic_buf->cur_pic->poc = ctx->frame_cnt;
        pic_buf->cur_pic->i_frame = (ctx->frame_type == VP8E_FRM_KEY);

        init_picbuf(ctx);

        if (ctx->frame_type == VP8E_FRM_P) {
            pic_buf->cur_pic->p_frame = 1;
            pic_buf->cur_pic->arf = 1;
            pic_buf->cur_pic->grf = 1;
            pic_buf->cur_pic->ipf = 1;
            pic_buf->ref_pic_list[0].search = 1;
            pic_buf->ref_pic_list[1].search = 1;
            pic_buf->ref_pic_list[2].search = 1;
        }

        if (ctx->rc->frame_coded == 0)
            return MPP_OK;

        if (ctx->rc->golden_picture_rate) {
            pic_buf->cur_pic->grf = 1;
            if (!pic_buf->cur_pic->arf)
                pic_buf->ref_pic_list[1].arf = 1;
        }
    }
    set_frame_params(ctx);
    set_picbuf_ref(ctx);
    set_code_frame(ctx);

    return MPP_OK;
}